

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O0

int write_file(char *filename,int selected_only)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  Fl_Type *pFStack_28;
  int q;
  Fl_Type *p;
  int selected_only_local;
  char *filename_local;
  
  iVar3 = open_write(filename);
  if (iVar3 == 0) {
    filename_local._4_4_ = 0;
  }
  else {
    write_string("# data file for the Fltk User Interface Designer (fluid)\nversion %.4f",
                 0x3ff07c84b5dcc63f);
    if (include_H_from_C == 0) {
      write_string("\ndo_not_include_H_from_C");
    }
    if (use_FL_COMMAND != 0) {
      write_string("\nuse_FL_COMMAND");
    }
    if (i18n_type != 0) {
      write_string("\ni18n_type %d",(ulong)(uint)i18n_type);
      write_string("\ni18n_include %s",i18n_include);
      if (i18n_type == 1) {
        write_string("\ni18n_function %s",i18n_function);
      }
      else if (i18n_type == 2) {
        if (*i18n_file != '\0') {
          write_string("\ni18n_file %s",i18n_file);
        }
        write_string("\ni18n_set %s",i18n_set);
      }
    }
    if (selected_only == 0) {
      write_string("\nheader_name");
      write_word(header_file_name);
      write_string("\ncode_name");
      write_word(code_file_name);
    }
    pFStack_28 = Fl_Type::first;
    while (pFStack_28 != (Fl_Type *)0x0) {
      if ((selected_only == 0) || (pFStack_28->selected != '\0')) {
        (*pFStack_28->_vptr_Fl_Type[0xc])();
        write_string("\n");
        piVar1 = &pFStack_28->level;
        pFStack_28 = pFStack_28->next;
        while( true ) {
          bVar2 = false;
          if (pFStack_28 != (Fl_Type *)0x0) {
            bVar2 = *piVar1 < pFStack_28->level;
          }
          if (!bVar2) break;
          pFStack_28 = pFStack_28->next;
        }
      }
      else {
        pFStack_28 = pFStack_28->next;
      }
    }
    filename_local._4_4_ = close_write();
  }
  return filename_local._4_4_;
}

Assistant:

int write_file(const char *filename, int selected_only) {
  if (!open_write(filename)) return 0;
  write_string("# data file for the Fltk User Interface Designer (fluid)\n"
	       "version %.4f",FL_VERSION);
  if(!include_H_from_C)
    write_string("\ndo_not_include_H_from_C");
  if(use_FL_COMMAND)
    write_string("\nuse_FL_COMMAND");
  if (i18n_type) {
    write_string("\ni18n_type %d", i18n_type);
    write_string("\ni18n_include %s", i18n_include);
    switch (i18n_type) {
    case 1 : /* GNU gettext */
	write_string("\ni18n_function %s", i18n_function);
        break;
    case 2 : /* POSIX catgets */
        if (i18n_file[0]) write_string("\ni18n_file %s", i18n_file);
	write_string("\ni18n_set %s", i18n_set);
        break;
    }
  }
  if (!selected_only) {
    write_string("\nheader_name"); write_word(header_file_name);
    write_string("\ncode_name"); write_word(code_file_name);
  }
  for (Fl_Type *p = Fl_Type::first; p;) {
    if (!selected_only || p->selected) {
      p->write();
      write_string("\n");
      int q = p->level;
      for (p = p->next; p && p->level > q; p = p->next) {/*empty*/}
    } else {
      p = p->next;
    }
  }
  return close_write();
}